

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O1

char * flatcc_json_parser_skip_constant(flatcc_json_parser_t *ctx,char *buf,char *end)

{
  byte bVar1;
  byte *buf_00;
  
  buf_00 = (byte *)buf;
  if (buf != end) {
    do {
      bVar1 = *buf_00;
      if (((bVar1 == 0x5f || (char)bVar1 < '\0') || (bVar1 == 0x2e || (byte)(bVar1 - 0x30) < 10)) ||
         ((byte)((bVar1 | 0x20) + 0x9f) < 0x1a)) {
        buf = (char *)(buf_00 + 1);
      }
      else {
        if ((long)end - (long)buf_00 < 2) {
LAB_00123d16:
          buf = flatcc_json_parser_space_ext(ctx,(char *)buf_00,end);
        }
        else {
          buf = (char *)buf_00;
          if ((char)bVar1 < '!') {
            if ((bVar1 != 0x20) || ((char)buf_00[1] < '!')) goto LAB_00123d16;
            buf = (char *)(buf_00 + 1);
          }
        }
        if ((byte *)buf == buf_00) {
          return (char *)(byte *)buf;
        }
      }
      buf_00 = (byte *)buf;
    } while (buf != end);
  }
  return (char *)(byte *)buf;
}

Assistant:

const char *flatcc_json_parser_skip_constant(flatcc_json_parser_t *ctx, const char *buf, const char *end)
{
    char c;
    const char *k;

    while (buf != end) {
        c = *buf;
        if ((c & 0x80) || (c == '_') || (c >= '0' && c <= '9') || c == '.') {
            ++buf;
            continue;
        }
        /* Upper case. */
        c |= 0x20;
        if (c >= 'a' && c <= 'z') {
            ++buf;
            continue;
        }
        buf = flatcc_json_parser_space(ctx, (k = buf), end);
        if (buf == k) {
            return buf;
        }
    }
    return buf;
}